

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_FindAllPackageNames_Test::
TestBody(SimpleDescriptorDatabaseExtraTest_FindAllPackageNames_Test *this)

{
  UnorderedElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher;
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  DescriptorProto *pDVar4;
  char *pcVar5;
  char *in_R9;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffb68;
  AssertHelper local_3a8;
  Message local_3a0;
  testing local_398 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_390;
  char local_388 [16];
  undefined1 local_378 [8];
  AssertionResult gtest_ar;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  SimpleDescriptorDatabase db;
  FileDescriptorProto b;
  undefined1 local_198 [8];
  FileDescriptorProto f;
  SimpleDescriptorDatabaseExtraTest_FindAllPackageNames_Test *this_local;
  
  f.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&f.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &f.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"foo.proto",
             pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&f.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set(&f.field_0._impl_.name_,"foo",pAVar3);
  pDVar4 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Foo",pAVar3);
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)
             &db.files_to_delete_.
              super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&b.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      &db.files_to_delete_.
                       super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &b.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"bar.proto",
             pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&b.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      &db.files_to_delete_.
                       super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  internal::ArenaStringPtr::Set(&b.field_0._impl_.name_,anon_var_dwarf_37cdd0 + 5,pAVar3);
  pDVar4 = FileDescriptorProto::add_message_type
                     ((FileDescriptorProto *)
                      &db.files_to_delete_.
                       super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puVar2 = internal::HasBits<1>::operator[](&(pDVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar4);
  internal::ArenaStringPtr::Set(&(pDVar4->field_0)._impl_.name_,"Bar",pAVar3);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)
             &packages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SimpleDescriptorDatabase::Add
            ((SimpleDescriptorDatabase *)
             &packages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(FileDescriptorProto *)local_198);
  SimpleDescriptorDatabase::Add
            ((SimpleDescriptorDatabase *)
             &packages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (FileDescriptorProto *)
             &db.files_to_delete_.
              super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar_.message_);
  local_331 = DescriptorDatabase::FindAllPackageNames
                        ((DescriptorDatabase *)
                         &packages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_330,
               (AssertionResult *)"db.FindAllPackageNames(&packages)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x20a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  testing::UnorderedElementsAre<char[4],char[1]>
            (local_398,(char (*) [4])0x1d63234,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffb68._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       _Stack_390.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_378,local_388,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"packages");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x20b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_.message_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)
             &packages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)
             &db.files_to_delete_.
              super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_198);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, FindAllPackageNames) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  FileDescriptorProto b;
  b.set_name("bar.proto");
  b.set_package("");
  b.add_message_type()->set_name("Bar");

  SimpleDescriptorDatabase db;
  db.Add(f);
  db.Add(b);

  std::vector<std::string> packages;
  EXPECT_TRUE(db.FindAllPackageNames(&packages));
  EXPECT_THAT(packages, ::testing::UnorderedElementsAre("foo", ""));
}